

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utVertexTriangleAdjacency.cpp
# Opt level: O0

void __thiscall VTAdjacencyTest::checkMesh(VTAdjacencyTest *this,aiMesh *mesh)

{
  long lVar1;
  bool bVar2;
  uint *puVar3;
  char *pcVar4;
  char *in_R9;
  string local_170;
  AssertHelper local_150;
  Message local_148;
  bool local_139;
  undefined1 local_138 [8];
  AssertionResult gtest_ar_;
  uint i_3;
  Message local_118;
  uint local_10c;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_2;
  uint idx_1;
  uint qq_1;
  aiFace *face_1;
  uint i_2;
  Message local_d8;
  uint local_cc;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_1;
  uint *puStack_b0;
  uint i_1;
  uint *pi;
  Message local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar;
  uint *puStack_80;
  uint tt;
  uint *pi_1;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint ofs;
  uint num;
  uint idx;
  uint qq;
  aiFace *face;
  uint i;
  uint maxOfs;
  uint *piNum;
  VertexTriangleAdjacency adj;
  aiMesh *mesh_local;
  VTAdjacencyTest *this_local;
  
  adj._24_8_ = mesh;
  Assimp::VertexTriangleAdjacency::VertexTriangleAdjacency
            ((VertexTriangleAdjacency *)&piNum,mesh->mFaces,mesh->mNumFaces,mesh->mNumVertices,true)
  ;
  _i = adj.mAdjacencyTable;
  face._4_4_ = 0;
  face._0_4_ = 0;
  do {
    if (*(uint *)(adj._24_8_ + 8) <= (uint)face) {
      puStack_b0 = adj.mOffsetTable;
      for (gtest_ar_1.message_.ptr_._4_4_ = 0; gtest_ar_1.message_.ptr_._4_4_ < face._4_4_;
          gtest_ar_1.message_.ptr_._4_4_ = gtest_ar_1.message_.ptr_._4_4_ + 1) {
        local_cc = 0xffffffff;
        testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
                  ((EqHelper<false> *)local_c8,"0xffffffff","*pi",&local_cc,puStack_b0);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
        if (!bVar2) {
          testing::Message::Message(&local_d8);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&stack0xffffffffffffff20,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utVertexTriangleAdjacency.cpp"
                     ,0xcc,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&stack0xffffffffffffff20,&local_d8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff20);
          testing::Message::~Message(&local_d8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
        puStack_b0 = puStack_b0 + 1;
      }
      for (face_1._4_4_ = 0; face_1._4_4_ < *(uint *)(adj._24_8_ + 8);
          face_1._4_4_ = face_1._4_4_ + 1) {
        lVar1 = *(long *)(adj._24_8_ + 0xd0);
        for (gtest_ar_2.message_.ptr_._4_4_ = 0; gtest_ar_2.message_.ptr_._4_4_ < 3;
            gtest_ar_2.message_.ptr_._4_4_ = gtest_ar_2.message_.ptr_._4_4_ + 1) {
          gtest_ar_2.message_.ptr_._0_4_ =
               *(uint *)(*(long *)(lVar1 + (ulong)face_1._4_4_ * 0x10 + 8) +
                        (ulong)gtest_ar_2.message_.ptr_._4_4_ * 4);
          local_10c = 0;
          testing::internal::CmpHelperNE<unsigned_int,unsigned_int>
                    ((internal *)local_108,"0U","piNum[idx]",&local_10c,
                     _i + (uint)gtest_ar_2.message_.ptr_);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
          if (!bVar2) {
            testing::Message::Message(&local_118);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xfffffffffffffee0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utVertexTriangleAdjacency.cpp"
                       ,0xd8,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xfffffffffffffee0,&local_118);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffee0)
            ;
            testing::Message::~Message(&local_118);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
          _i[(uint)gtest_ar_2.message_.ptr_] = _i[(uint)gtest_ar_2.message_.ptr_] - 1;
        }
      }
      for (gtest_ar_.message_.ptr_._4_4_ = 0;
          gtest_ar_.message_.ptr_._4_4_ < *(uint *)(adj._24_8_ + 4);
          gtest_ar_.message_.ptr_._4_4_ = gtest_ar_.message_.ptr_._4_4_ + 1) {
        local_139 = _i[gtest_ar_.message_.ptr_._4_4_] == 0;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_138,&local_139,(type *)0x0);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
        if (!bVar2) {
          testing::Message::Message(&local_148);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_170,(internal *)local_138,(AssertionResult *)"piNum[i]","true","false",
                     in_R9);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_150,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utVertexTriangleAdjacency.cpp"
                     ,0xe0,pcVar4);
          testing::internal::AssertHelper::operator=(&local_150,&local_148);
          testing::internal::AssertHelper::~AssertHelper(&local_150);
          std::__cxx11::string::~string((string *)&local_170);
          testing::Message::~Message(&local_148);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
      }
      Assimp::VertexTriangleAdjacency::~VertexTriangleAdjacency((VertexTriangleAdjacency *)&piNum);
      return;
    }
    _idx = *(long *)(adj._24_8_ + 0xd0) + (ulong)(uint)face * 0x10;
    for (num = 0; num < 3; num = num + 1) {
      ofs = *(uint *)(*(long *)(_idx + 8) + (ulong)num * 4);
      local_5c = _i[ofs];
      local_60 = piNum[ofs];
      local_64 = local_60 + local_5c;
      puVar3 = std::max<unsigned_int>(&local_64,(uint *)((long)&face + 4));
      face._4_4_ = *puVar3;
      puStack_80 = adj.mOffsetTable + local_60;
      for (gtest_ar.message_.ptr_._4_4_ = 0; gtest_ar.message_.ptr_._4_4_ < local_5c;
          gtest_ar.message_.ptr_._4_4_ = gtest_ar.message_.ptr_._4_4_ + 1) {
        if ((uint)face == *puStack_80) {
          *puStack_80 = 0xffffffff;
          break;
        }
        puStack_80 = puStack_80 + 1;
      }
      testing::internal::CmpHelperLT<unsigned_int,unsigned_int>
                ((internal *)local_98,"tt","num",(uint *)((long)&gtest_ar.message_.ptr_ + 4),
                 &local_5c);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
      if (!bVar2) {
        testing::Message::Message(&local_a0);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&pi,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utVertexTriangleAdjacency.cpp"
                   ,0xc4,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&pi,&local_a0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&pi);
        testing::Message::~Message(&local_a0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
    }
    face._0_4_ = (uint)face + 1;
  } while( true );
}

Assistant:

void VTAdjacencyTest::checkMesh(const aiMesh& mesh)
{
    VertexTriangleAdjacency adj(mesh.mFaces,mesh.mNumFaces,mesh.mNumVertices,true);

    unsigned int* const piNum = adj.mLiveTriangles;

    // check the primary adjacency table and check whether all faces
    // are contained in the list
    unsigned int maxOfs = 0;
    for (unsigned int i = 0; i < mesh.mNumFaces;++i)
    {
        aiFace& face = mesh.mFaces[i];
        for (unsigned int qq = 0; qq < 3 ;++qq)
        {
            const unsigned int idx = face.mIndices[qq];
            const unsigned int num = piNum[idx];

            // go to this offset
            const unsigned int ofs = adj.mOffsetTable[idx];
            maxOfs = std::max(ofs+num,maxOfs);
            unsigned int* pi = &adj.mAdjacencyTable[ofs];

            // and search for us ...
            unsigned int tt = 0;
            for (; tt < num;++tt,++pi)
            {
                if (i == *pi)
                {
                    // mask our entry in the table. Finally all entries should be masked
                    *pi = 0xffffffff;

                    // there shouldn't be two entries for the same face
                    break;
                }
            }
            // assert if *this* vertex has not been found in the table
            EXPECT_LT(tt, num);
        }
    }

    // now check whether there are invalid faces
    const unsigned int* pi = adj.mAdjacencyTable;
    for (unsigned int i = 0; i < maxOfs;++i,++pi)
    {
        EXPECT_EQ(0xffffffff, *pi);
    }

    // check the numTrianglesPerVertex table
    for (unsigned int i = 0; i < mesh.mNumFaces;++i)
    {
        aiFace& face = mesh.mFaces[i];
        for (unsigned int qq = 0; qq < 3 ;++qq)
        {
            const unsigned int idx = face.mIndices[qq];

            // we should not reach 0 here ...
            EXPECT_NE(0U, piNum[idx]);
            piNum[idx]--;
        }
    }

    // check whether we reached 0 in all entries
    for (unsigned int i = 0; i < mesh.mNumVertices;++i)
    {
        EXPECT_FALSE(piNum[i]);
    }
}